

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderInterp *this,Index segment_index,Index func_index)

{
  Result RVar1;
  Location local_98;
  Var local_70;
  
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,func_index,&local_98);
  RVar1 = SharedValidator::OnElemSegmentElemExpr_RefFunc
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  if (RVar1.enum_ != Error) {
    local_98.filename.data_ = (char *)CONCAT44(func_index,1);
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
    emplace_back<wabt::interp::ElemExpr>
              (&(this->module_->elems).
                super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].elements,(ElemExpr *)&local_98);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                         Index func_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefFunc(loc, Var(func_index)));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefFunc, func_index});
  return Result::Ok;
}